

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_zip.c
# Opt level: O3

wchar_t cmp_node(archive_rb_node *n1,archive_rb_node *n2)

{
  wchar_t wVar1;
  
  wVar1 = L'\xffffffff';
  if ((long)n1[1].rb_nodes[1] <= (long)n2[1].rb_nodes[1]) {
    wVar1 = (wchar_t)((long)n1[1].rb_nodes[1] < (long)n2[1].rb_nodes[1]);
  }
  return wVar1;
}

Assistant:

static int
cmp_node(const struct archive_rb_node *n1, const struct archive_rb_node *n2)
{
	const struct zip_entry *e1 = (const struct zip_entry *)n1;
	const struct zip_entry *e2 = (const struct zip_entry *)n2;

	if (e1->local_header_offset > e2->local_header_offset)
		return -1;
	if (e1->local_header_offset < e2->local_header_offset)
		return 1;
	return 0;
}